

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O0

int __thiscall
Fl_Input_Choice_Type::textstuff(Fl_Input_Choice_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Font FVar1;
  Fl_Fontsize FVar2;
  Fl_Color FVar3;
  Fl_Input_Choice *local_48;
  Fl_Input_Choice *myo;
  Fl_Color *c_local;
  int *s_local;
  Fl_Font *f_local;
  int w_local;
  Fl_Input_Choice_Type *this_local;
  
  if (w == 4) {
    local_48 = (Fl_Input_Choice *)
               (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.factory[1].prev;
  }
  else {
    local_48 = (Fl_Input_Choice *)(this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  }
  switch(w) {
  case 0:
  case 4:
    FVar1 = Fl_Input_Choice::textfont(local_48);
    *f = FVar1;
    FVar2 = Fl_Input_Choice::textsize(local_48);
    *s = FVar2;
    FVar3 = Fl_Input_Choice::textcolor(local_48);
    *c = FVar3;
    break;
  case 1:
    Fl_Input_Choice::textfont(local_48,*f);
    break;
  case 2:
    Fl_Input_Choice::textsize(local_48,*s);
    break;
  case 3:
    Fl_Input_Choice::textcolor(local_48,*c);
  }
  return 1;
}

Assistant:

int textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
    Fl_Input_Choice *myo = (Fl_Input_Choice*)(w==4 ? ((Fl_Widget_Type*)this->factory)->o : this->o);
    switch (w) {
    case 4:
    case 0: f = (Fl_Font)myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
    }
    return 1;
  }